

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChProximityContainerMeshless.cpp
# Opt level: O1

void __thiscall
chrono::ChProximityContainerMeshless::~ChProximityContainerMeshless
          (ChProximityContainerMeshless *this)

{
  list<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_> *this_00;
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  
  (this->super_ChProximityContainer).super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChProximityContainerMeshless_00b4fd78;
  this_00 = &this->proximitylist;
  for (p_Var2 = (this->proximitylist).
                super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
                ._M_impl._M_node.super__List_node_base._M_next; p_Var2 != (_List_node_base *)this_00
      ; p_Var2 = p_Var2->_M_next) {
    if (p_Var2[1]._M_next != (_List_node_base *)0x0) {
      (**(code **)((long)(p_Var2[1]._M_next)->_M_next + 8))();
    }
    p_Var2[1]._M_next = (_List_node_base *)0x0;
  }
  std::__cxx11::list<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
  ::clear(this_00);
  p_Var2 = (this->proximitylist).
           super__List_base<chrono::ChProximityMeshless_*,_std::allocator<chrono::ChProximityMeshless_*>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  (this->lastproximity)._M_node = p_Var2;
  this->n_added = 0;
  while (p_Var2 != (_List_node_base *)this_00) {
    p_Var1 = p_Var2->_M_next;
    operator_delete(p_Var2,0x18);
    p_Var2 = p_Var1;
  }
  ChPhysicsItem::~ChPhysicsItem((ChPhysicsItem *)this);
  return;
}

Assistant:

ChProximityContainerMeshless::~ChProximityContainerMeshless() {
    std::list<ChProximityMeshless*>::iterator iterproximity = proximitylist.begin();
    while (iterproximity != proximitylist.end()) {
        delete (*iterproximity);
        (*iterproximity) = 0;
        ++iterproximity;
        // proximitylist.erase(iterproximity); //no! do later with clear(), all together
    }
    proximitylist.clear();

    lastproximity = proximitylist.begin();
    n_added = 0;
}